

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dau_DsdToGia(Gia_Man_t *pGia,char *p,int *pLits,Vec_Int_t *vCover)

{
  int *pMatches;
  int local_2c;
  int Res;
  Vec_Int_t *vCover_local;
  int *pLits_local;
  char *p_local;
  Gia_Man_t *pGia_local;
  
  pLits_local = (int *)p;
  p_local = (char *)pGia;
  if ((*p == '0') && (p[1] == '\0')) {
    local_2c = 0;
  }
  else if ((*p == '1') && (p[1] == '\0')) {
    local_2c = 1;
  }
  else {
    pMatches = Dau_DsdComputeMatches(p);
    local_2c = Dau_DsdToGia_rec(pGia,p,(char **)&pLits_local,pMatches,pLits,vCover);
  }
  if (*(char *)((long)pLits_local + 1) != '\0') {
    pLits_local = (int *)((long)pLits_local + 1);
    __assert_fail("*++p == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                  ,0x1aa,"int Dau_DsdToGia(Gia_Man_t *, char *, int *, Vec_Int_t *)");
  }
  return local_2c;
}

Assistant:

int Dau_DsdToGia( Gia_Man_t * pGia, char * p, int * pLits, Vec_Int_t * vCover )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Dau_DsdToGia_rec( pGia, p, &p, Dau_DsdComputeMatches(p), pLits, vCover );
    assert( *++p == 0 );
    return Res;
}